

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O2

pid_t proc_spawn(char **args)

{
  char *__s;
  uint uVar1;
  char *pcVar2;
  int i;
  int __fd;
  char *__format;
  
  uVar1 = fork();
  if (uVar1 != 0) {
    printf("Spawning process [PID=%d]:",(ulong)uVar1);
    for (; __s = *args, __s != (char *)0x0; args = args + 1) {
      pcVar2 = strchr(__s,0x20);
      __format = " \'%s\'";
      if (pcVar2 == (char *)0x0) {
        __format = " %s";
      }
      printf(__format,__s);
    }
    putchar(10);
    return uVar1;
  }
  close(0);
  for (__fd = 3; __fd != 0x100; __fd = __fd + 1) {
    close(__fd);
  }
  execvp(*args,args);
  perror("Failed");
  exit(1);
}

Assistant:

pid_t proc_spawn(char *const args[]) {
    pid_t pid = 0;
    if ((pid = fork()) == 0) {

#if !SHARE_STDIN
        close(STDIN_FILENO);
#endif
#if !SHARE_STDOUT
        close(STDOUT_FILENO);
#endif
#if !SHARE_STDERR
        close(STDERR_FILENO);
#endif

        //
        // Close opened filedescriptors from parent
        //
        for (int i = STDERR_FILENO + 1; i < 256; i++)
            close(i);

#if !SHARE_PROCESS_GROUP
        setsid();
#endif

        execvp(args[0], args);
        perror("Failed");
        exit(EXIT_FAILURE);
    }

    printf("Spawning process [PID=%d]:", pid);
    for (int32_t i = 0; args[i] != NULL; i++) {
        if (strchr(args[i], ' ')) {
            printf(" '%s'", args[i]);
        } else {
            printf(" %s", args[i]);
        }
    }
    printf("\n");
    return pid;
}